

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gls::Functional::anon_unknown_0::FramebufferClearCase::iterate(FramebufferClearCase *this)

{
  pointer log;
  RenderContext *renderCtx;
  Color color;
  Color color_00;
  bool bVar1;
  int iVar2;
  ContextType type;
  GLSLVersion version;
  GLenum GVar3;
  undefined4 extraout_var;
  char *description;
  int x;
  float depth;
  int iVar4;
  int y;
  qpTestResult testResult;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  Vector<int,_4> local_3a8;
  BufferFmtDesc local_390;
  float local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 local_370;
  float local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined4 local_358;
  PixelBufferAccess refAccess;
  Renderbuffer depthbuf;
  Renderbuffer colorbuf;
  Framebuffer fbo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resData;
  vector<unsigned_char,_std::allocator<unsigned_char>_> refData;
  PixelBufferAccess resAccess;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  ShaderProgram shader;
  Functions *gl;
  
  log = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  renderCtx = this->m_renderCtx;
  type.super_ApiType.m_bits = (ApiType)(*renderCtx->_vptr_RenderContext[2])(renderCtx);
  version = glu::getContextTypeGLSLVersion(type);
  genShaders((ProgramSources *)local_288,version);
  glu::ShaderProgram::ShaderProgram(&shader,renderCtx,(ProgramSources *)local_288);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_288);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper(&fbo,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&colorbuf,gl);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper(&depthbuf,gl);
  local_390 = getBufferFormat(this->m_clearType);
  if (local_390.colorFmt == 0x8d7c) {
    depth = 2.8026e-45;
LAB_014d4919:
    local_3b4 = 0;
    local_3b8 = 0;
    local_3b0 = 0;
    local_3ac = 0;
  }
  else {
    if (local_390.colorFmt == 0x8d8e) {
      depth = 1.4013e-45;
      goto LAB_014d4919;
    }
    depth = 0.0;
    local_3ac = 0x3f800000;
    local_3b0 = 0x3f000000;
    local_3b8 = 0x3e800000;
    local_3b4 = 0x3e000000;
  }
  local_3a8.m_data[0] = 8;
  local_3a8.m_data[1] = 8;
  local_3a8.m_data[2] = 0x30;
  local_3a8.m_data[3] = 0x30;
  iVar2 = tcu::TextureFormat::getPixelSize(&local_390.texFmt);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&refData,(long)(iVar2 << 0xc),(allocator_type *)local_288);
  iVar2 = tcu::TextureFormat::getPixelSize(&local_390.texFmt);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&resData,(long)(iVar2 << 0xc),(allocator_type *)local_288);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&refAccess,&local_390.texFmt,0x40,0x40,1,
             refData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&resAccess,&local_390.texFmt,0x40,0x40,1,
             resData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (shader.m_program.m_info.linkOk == false) {
    glu::operator<<((TestLog *)log,&shader);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader compile/link failed");
    goto LAB_014d5007;
  }
  (*gl->bindFramebuffer)(0x8ca9,fbo.super_ObjectWrapper.m_object);
  (*gl->bindFramebuffer)(0x8ca8,fbo.super_ObjectWrapper.m_object);
  (*gl->bindRenderbuffer)(0x8d41,colorbuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,local_390.colorFmt,0x40,0x40);
  (*gl->framebufferRenderbuffer)(0x8ca9,0x8ce0,0x8d41,colorbuf.super_ObjectWrapper.m_object);
  (*gl->bindRenderbuffer)(0x8d41,depthbuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x88f0,0x40,0x40);
  (*gl->framebufferRenderbuffer)(0x8ca9,0x821a,0x8d41,depthbuf.super_ObjectWrapper.m_object);
  local_288 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
  std::operator<<((ostream *)&uStack_280,"Scissor area is ");
  tcu::operator<<((ostream *)&uStack_280,&local_3a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
  local_288 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
  std::operator<<((ostream *)&uStack_280,"Rendering reference (scissors disabled)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
  (*gl->useProgram)(shader.m_program.m_program);
  iVar2 = 0;
  (*gl->viewport)(0,0,0x40,0x40);
  (*gl->disable)(0xb71);
  (*gl->disable)(0xb90);
  (*gl->disable)(0xc11);
  uStack_364 = local_3b4;
  uStack_360 = local_3b8;
  uStack_35c = local_3b0;
  local_358 = local_3ac;
  color.field_1.i[0] = local_3b4;
  color.type = (Type)depth;
  color.field_1.i[1] = local_3b8;
  color.field_1.i[2] = local_3b0;
  color.field_1.i[3] = local_3ac;
  local_368 = depth;
  clearBuffers(gl,color,depth,iVar2);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
  glu::readPixels(this->m_renderCtx,0,0,&refAccess);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                  ,0x29e);
  local_288 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
  std::operator<<((ostream *)&uStack_280,"Rendering result (scissors enabled)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
  (*gl->useProgram)(shader.m_program.m_program);
  iVar2 = 0;
  (*gl->viewport)(0,0,0x40,0x40);
  (*gl->disable)(0xb71);
  (*gl->disable)(0xb90);
  (*gl->disable)(0xc11);
  uStack_37c = local_3b4;
  uStack_378 = local_3b8;
  uStack_374 = local_3b0;
  local_370 = local_3ac;
  color_00.field_1.i[0] = local_3b4;
  color_00.type = (Type)depth;
  color_00.field_1.i[1] = local_3b8;
  color_00.field_1.i[2] = local_3b0;
  color_00.field_1.i[3] = local_3ac;
  local_380 = depth;
  clearBuffers(gl,color_00,depth,iVar2);
  (*gl->enable)(0xc11);
  (*gl->scissor)(local_3a8.m_data[0],local_3a8.m_data[1],local_3a8.m_data[2],local_3a8.m_data[3]);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])(this);
  glu::readPixels(this->m_renderCtx,0,0,&resAccess);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsScissorTests.cpp"
                  ,0x2b4);
  if (depth == 0.0) {
    local_288._4_4_ = local_3b8;
    local_288._0_4_ = local_3b4;
    uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
    for (iVar2 = 0; iVar2 < refAccess.super_ConstPixelBufferAccess.m_size.m_data[1];
        iVar2 = iVar2 + 1) {
      for (iVar4 = 0; iVar4 < refAccess.super_ConstPixelBufferAccess.m_size.m_data[0];
          iVar4 = iVar4 + 1) {
        if ((((iVar2 < local_3a8.m_data[1]) || (local_3a8.m_data[1] + local_3a8.m_data[3] <= iVar2))
            || (iVar4 < local_3a8.m_data[0])) ||
           (local_3a8.m_data[0] + local_3a8.m_data[2] <= iVar4)) {
          tcu::PixelBufferAccess::setPixel(&refAccess,(Vec4 *)local_288,iVar4,iVar2,0);
        }
      }
    }
    local_288 = (undefined1  [8])0x3ca3d70a3ca3d70a;
    uStack_280 = (pointer)0x3ca3d70a3ca3d70a;
    bVar1 = tcu::floatThresholdCompare
                      ((TestLog *)log,"ComparisonResult","Image comparison result",
                       &refAccess.super_ConstPixelBufferAccess,
                       &resAccess.super_ConstPixelBufferAccess,(Vec4 *)local_288,COMPARE_LOG_RESULT)
    ;
LAB_014d4fe5:
    if (bVar1 == false) goto LAB_014d4dfd;
LAB_014d4ff1:
    description = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    if (depth != 1.4013e-45) {
      local_288._4_4_ = local_3b8;
      local_288._0_4_ = local_3b4;
      uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
      for (iVar2 = 0; iVar2 < refAccess.super_ConstPixelBufferAccess.m_size.m_data[1];
          iVar2 = iVar2 + 1) {
        for (iVar4 = 0; iVar4 < refAccess.super_ConstPixelBufferAccess.m_size.m_data[0];
            iVar4 = iVar4 + 1) {
          if (((iVar2 < local_3a8.m_data[1]) || (local_3a8.m_data[1] + local_3a8.m_data[3] <= iVar2)
              ) || ((iVar4 < local_3a8.m_data[0] ||
                    (local_3a8.m_data[0] + local_3a8.m_data[2] <= iVar4)))) {
            tcu::PixelBufferAccess::setPixel(&refAccess,(UVec4 *)local_288,iVar4,iVar2,0);
          }
        }
      }
      local_288 = (undefined1  [8])0x200000002;
      uStack_280 = (pointer)0x200000002;
      bVar1 = tcu::intThresholdCompare
                        ((TestLog *)log,"ComparisonResult","Image comparison result",
                         &refAccess.super_ConstPixelBufferAccess,
                         &resAccess.super_ConstPixelBufferAccess,(UVec4 *)local_288,
                         COMPARE_LOG_RESULT);
      goto LAB_014d4fe5;
    }
    local_288._4_4_ = local_3b8;
    local_288._0_4_ = local_3b4;
    uStack_280 = (pointer)CONCAT44(local_3ac,local_3b0);
    Functional::(anonymous_namespace)::clearEdges<tcu::Vector<int,4>>
              (&refAccess,(Vector<int,_4> *)local_288,&local_3a8);
    local_288 = (undefined1  [8])0x200000002;
    uStack_280 = (pointer)0x200000002;
    bVar1 = tcu::intThresholdCompare
                      ((TestLog *)log,"ComparisonResult","Image comparison result",
                       &refAccess.super_ConstPixelBufferAccess,
                       &resAccess.super_ConstPixelBufferAccess,(UVec4 *)local_288,COMPARE_LOG_RESULT
                      );
    if (bVar1) goto LAB_014d4ff1;
LAB_014d4dfd:
    testResult = QP_TEST_RESULT_FAIL;
    description = "Image comparison failed";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,testResult,description);
LAB_014d5007:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&resData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&refData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  glu::ObjectWrapper::~ObjectWrapper(&depthbuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colorbuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
  glu::ShaderProgram::~ShaderProgram(&shader);
  return STOP;
}

Assistant:

FramebufferClearCase::IterateResult FramebufferClearCase::iterate (void)
{
	TestLog&					log				= m_testCtx.getLog();
	const glw::Functions&		gl				= m_renderCtx.getFunctions();
	const glu::ShaderProgram	shader			(m_renderCtx, genShaders(glu::getContextTypeGLSLVersion(m_renderCtx.getType())));

	const glu::Framebuffer		fbo				(gl);
	const glu::Renderbuffer		colorbuf		(gl);
	const glu::Renderbuffer		depthbuf		(gl);

	const BufferFmtDesc			bufferFmt		= getBufferFormat(m_clearType);
	const Color					baseColor		= getBaseColor(bufferFmt);

	const int					width			= 64;
	const int					height			= 64;

	const IVec4					scissorArea		(8, 8, 48, 48);

	vector<deUint8>				refData			(width*height*bufferFmt.texFmt.getPixelSize());
	vector<deUint8>				resData			(width*height*bufferFmt.texFmt.getPixelSize());

	tcu::PixelBufferAccess		refAccess		(bufferFmt.texFmt, width, height, 1, &refData[0]);
	tcu::PixelBufferAccess		resAccess		(bufferFmt.texFmt, width, height, 1, &resData[0]);

	if (!shader.isOk())
	{
		log << shader;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader compile/link failed");
		return STOP;
	}

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *fbo);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *fbo);

	// Color
	gl.bindRenderbuffer(GL_RENDERBUFFER, *colorbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, bufferFmt.colorFmt, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorbuf);

	// Depth/stencil
	gl.bindRenderbuffer(GL_RENDERBUFFER, *depthbuf);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, width, height);
	gl.framebufferRenderbuffer(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, *depthbuf);

	log << TestLog::Message << "Scissor area is " << scissorArea << TestLog::EndMessage;

	// Render reference
	{
		log << TestLog::Message << "Rendering reference (scissors disabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, refAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	// Render result
	{
		log << TestLog::Message << "Rendering result (scissors enabled)" << TestLog::EndMessage;

		gl.useProgram(shader.getProgram());
		gl.viewport(0, 0, width, height);

		gl.disable(GL_DEPTH_TEST);
		gl.disable(GL_STENCIL_TEST);
		gl.disable(GL_SCISSOR_TEST);

		clearBuffers(gl, baseColor, 1.0f, 0);

		gl.enable(GL_SCISSOR_TEST);
		gl.scissor(scissorArea.x(), scissorArea.y(), scissorArea.z(), scissorArea.w());

		render(shader.getProgram());

		glu::readPixels(m_renderCtx, 0, 0, resAccess);
		GLU_CHECK_ERROR(gl.getError());
	}

	{
		bool resultOk = false;

		switch (baseColor.type)
		{
			case Color::FLOAT:
				clearEdges(refAccess, Vec4(baseColor.f[0], baseColor.f[1], baseColor.f[2], baseColor.f[3]), scissorArea);
				resultOk = tcu::floatThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, Vec4(0.02f, 0.02f, 0.02f, 0.02f), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::INT:
				clearEdges(refAccess, IVec4(baseColor.i[0], baseColor.i[1], baseColor.i[2], baseColor.i[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;

			case Color::UINT:
				clearEdges(refAccess, UVec4(baseColor.u[0], baseColor.u[1], baseColor.u[2], baseColor.u[3]), scissorArea);
				resultOk = tcu::intThresholdCompare(log, "ComparisonResult", "Image comparison result", refAccess, resAccess, UVec4(2, 2, 2, 2), tcu::COMPARE_LOG_RESULT);
				break;
		}

		if (resultOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}